

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

module * __thiscall
pybind11::module::def<pybind11_init_ikfast_ur10e(pybind11::module&)::__1,pybind11::arg,char[64]>
          (module *this,char *name_,type *f,arg *extra,char (*extra_1) [64])

{
  handle local_70;
  PyObject *local_68;
  handle local_60;
  handle local_58;
  sibling local_50;
  scope local_48;
  name local_40;
  handle local_38;
  cpp_function func;
  char (*extra_local_1) [64];
  arg *extra_local;
  type *f_local;
  char *name__local;
  module *this_local;
  
  func.super_function.super_object.super_handle.m_ptr = (function)(function)extra_1;
  pybind11::name::name(&local_40,name_);
  scope::scope(&local_48,(handle *)this);
  local_60.m_ptr = (this->super_object).super_handle.m_ptr;
  none::none((none *)&local_70);
  local_68 = local_70.m_ptr;
  getattr((pybind11 *)&local_58,local_60,name_,local_70);
  sibling::sibling(&local_50,&local_58);
  cpp_function::
  cpp_function<pybind11_init_ikfast_ur10e(pybind11::module&)::__1,pybind11::name,pybind11::scope,pybind11::sibling,pybind11::arg,char[64],void>
            ((cpp_function *)&local_38,f,&local_40,&local_48,&local_50,extra,
             (char (*) [64])func.super_function.super_object.super_handle.m_ptr);
  object::~object((object *)&local_58);
  none::~none((none *)&local_70);
  add_object(this,name_,local_38,true);
  cpp_function::~cpp_function((cpp_function *)&local_38);
  return this;
}

Assistant:

module &def(const char *name_, Func &&f, const Extra& ... extra) {
        cpp_function func(std::forward<Func>(f), name(name_), scope(*this),
                          sibling(getattr(*this, name_, none())), extra...);
        // NB: allow overwriting here because cpp_function sets up a chain with the intention of
        // overwriting (and has already checked internally that it isn't overwriting non-functions).
        add_object(name_, func, true /* overwrite */);
        return *this;
    }